

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kyber.cc
# Opt level: O2

int kyber_marshal_public_key(CBB *out,public_key *pub)

{
  int iVar1;
  uint uVar2;
  uint8_t *in_RAX;
  uint8_t *vector_output;
  
  vector_output = in_RAX;
  iVar1 = CBB_add_space(out,&vector_output,0x480);
  if (iVar1 == 0) {
    uVar2 = 0;
  }
  else {
    vector_encode(vector_output,&pub->t,0xc);
    iVar1 = CBB_add_bytes(out,pub->rho,0x20);
    uVar2 = (uint)(iVar1 != 0);
  }
  return uVar2;
}

Assistant:

static int kyber_marshal_public_key(CBB *out, const struct public_key *pub) {
  uint8_t *vector_output;
  if (!CBB_add_space(out, &vector_output, kEncodedVectorSize)) {
    return 0;
  }
  vector_encode(vector_output, &pub->t, kLog2Prime);
  if (!CBB_add_bytes(out, pub->rho, sizeof(pub->rho))) {
    return 0;
  }
  return 1;
}